

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O0

int units::precise::custom::eq_type(unit_data *UT)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  unit_data *UT_local;
  
  iVar2 = detail::unit_data::radian(UT);
  iVar3 = 0;
  if (iVar2 != 0) {
    iVar3 = 0x10;
  }
  iVar2 = detail::unit_data::count(UT);
  iVar4 = 0;
  if (iVar2 != 0) {
    iVar4 = 8;
  }
  bVar1 = detail::unit_data::is_per_unit(UT);
  iVar2 = 0;
  if (bVar1) {
    iVar2 = 4;
  }
  bVar1 = detail::unit_data::has_i_flag(UT);
  iVar5 = 0;
  if (bVar1) {
    iVar5 = 2;
  }
  bVar1 = detail::unit_data::has_e_flag(UT);
  return iVar3 + iVar4 + iVar2 + iVar5 + (uint)bVar1;
}

Assistant:

inline constexpr int eq_type(const detail::unit_data& UT)
        {
            return ((UT.radian() != 0) ? 16 : 0) + ((UT.count() != 0) ? 8 : 0) +
                (UT.is_per_unit() ? 4 : 0) + (UT.has_i_flag() ? 2 : 0) +
                (UT.has_e_flag() ? 1 : 0);
        }